

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O3

CatalogEntryInfo *
duckdb::DependencyManager::GetLookupProperties
          (CatalogEntryInfo *__return_storage_ptr__,CatalogEntry *entry)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  CatalogEntry *in_RDX;
  string schema;
  string local_48;
  CatalogType *pCVar3;
  
  if (entry->type == DEPENDENCY_ENTRY) {
    iVar2 = (*entry->_vptr_CatalogEntry[0x10])(entry);
    pCVar3 = (CatalogType *)CONCAT44(extraout_var,iVar2);
    __return_storage_ptr__->type = *pCVar3;
    (__return_storage_ptr__->schema)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->schema).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->schema,*(undefined8 *)(pCVar3 + 8),
               *(undefined8 *)(pCVar3 + 0x10) + *(undefined8 *)(pCVar3 + 8));
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->name,*(undefined8 *)(pCVar3 + 0x28),
               *(undefined8 *)(pCVar3 + 0x30) + *(undefined8 *)(pCVar3 + 0x28));
  }
  else {
    GetSchema_abi_cxx11_(&local_48,(DependencyManager *)entry,in_RDX);
    __return_storage_ptr__->type = entry->type;
    (__return_storage_ptr__->schema)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->schema).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->schema,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    pcVar1 = (entry->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->name,pcVar1,
               pcVar1 + (entry->name)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryInfo DependencyManager::GetLookupProperties(const CatalogEntry &entry) {
	if (entry.type == CatalogType::DEPENDENCY_ENTRY) {
		auto &dependency_entry = entry.Cast<DependencyEntry>();
		return dependency_entry.EntryInfo();
	} else {
		auto schema = DependencyManager::GetSchema(entry);
		auto &name = entry.name;
		auto &type = entry.type;
		return CatalogEntryInfo {type, schema, name};
	}
}